

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_vec2 nk_layout_space_to_screen(nk_context *ctx,nk_vec2 ret)

{
  undefined4 uVar1;
  undefined4 uVar2;
  nk_panel *pnVar3;
  nk_vec2 nVar4;
  undefined1 auVar5 [16];
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4cfd,
                  "struct nk_vec2 nk_layout_space_to_screen(struct nk_context *, struct nk_vec2)");
  }
  if (ctx->current != (nk_window *)0x0) {
    pnVar3 = ctx->current->layout;
    if (pnVar3 != (nk_panel *)0x0) {
      auVar5._4_4_ = 0;
      auVar5._0_4_ = *pnVar3->offset_x;
      auVar5._8_4_ = *pnVar3->offset_y;
      auVar5._12_4_ = 0;
      uVar1 = pnVar3->at_x;
      uVar2 = pnVar3->at_y;
      nVar4.y = ((float)uVar2 - (float)(SUB168(auVar5 | _DAT_001542f0,8) - DAT_001542f0._8_8_)) +
                ret.y;
      nVar4.x = ((float)uVar1 - (float)(SUB168(auVar5 | _DAT_001542f0,0) - (double)DAT_001542f0)) +
                ret.x;
      return nVar4;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4cff,
                  "struct nk_vec2 nk_layout_space_to_screen(struct nk_context *, struct nk_vec2)");
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x4cfe,
                "struct nk_vec2 nk_layout_space_to_screen(struct nk_context *, struct nk_vec2)");
}

Assistant:

NK_API struct nk_vec2
nk_layout_space_to_screen(struct nk_context *ctx, struct nk_vec2 ret)
{
    struct nk_window *win;
    struct nk_panel *layout;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    win = ctx->current;
    layout = win->layout;

    ret.x += layout->at_x - (float)*layout->offset_x;
    ret.y += layout->at_y - (float)*layout->offset_y;
    return ret;
}